

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

MPP_RET str_to_frm_fmt(char *nptr,long *number)

{
  int *piVar1;
  long lVar2;
  long tmp;
  char *endptr;
  long *plStack_18;
  MPP_RET ret;
  long *number_local;
  char *nptr_local;
  
  endptr._4_4_ = MPP_NOK;
  plStack_18 = number;
  number_local = (long *)nptr;
  if ((nptr == (char *)0x0) || (number == (long *)0x0)) {
    _mpp_log_l(2,"utils","invalid input nptr %p number %p is_valid %p\n","str_to_frm_fmt",nptr,
               number);
    endptr._4_4_ = MPP_ERR_NULL_PTR;
  }
  else if (nptr != (char *)0x0) {
    tmp = 0;
    piVar1 = __errno_location();
    *piVar1 = 0;
    lVar2 = strtol((char *)number_local,(char **)&tmp,0);
    if (number_local == (long *)tmp) {
      _mpp_log_l(2,"utils","format: 0x%lx  invalid  (no digits found, 0 returned)",0,lVar2);
    }
    else {
      piVar1 = __errno_location();
      if ((*piVar1 == 0x22) && (lVar2 == -0x8000000000000000)) {
        _mpp_log_l(2,"utils","format: 0x%lx  invalid  (underflow occurred)",0,0x8000000000000000);
      }
      else {
        piVar1 = __errno_location();
        if ((*piVar1 == 0x22) && (lVar2 == 0x7fffffffffffffff)) {
          _mpp_log_l(2,"utils","format: 0x%lx  invalid  (overflow occurred)",0,0x7fffffffffffffff);
        }
        else {
          piVar1 = __errno_location();
          if (*piVar1 == 0x16) {
            _mpp_log_l(2,"utils","format: 0x%lx  invalid  (base contains unsupported value)",0,lVar2
                      );
          }
          else {
            piVar1 = __errno_location();
            if ((*piVar1 == 0) || (lVar2 != 0)) {
              piVar1 = __errno_location();
              if ((*piVar1 == 0) && ((number_local != (long *)0x0 && (*(char *)tmp != '\0')))) {
                _mpp_log_l(2,"utils","format: 0x%lx  invalid  (additional characters remain)",0,
                           lVar2);
              }
              else {
                piVar1 = __errno_location();
                if ((*piVar1 == 0) && ((number_local != (long *)0x0 && (*(char *)tmp == '\0')))) {
                  if ((lVar2 < 0xff10011) && (-1 < lVar2)) {
                    *plStack_18 = lVar2;
                    endptr._4_4_ = MPP_OK;
                  }
                  else {
                    _mpp_log_l(2,"utils","format: 0x%lx  invalid  (not format value)",0,lVar2);
                  }
                }
              }
            }
            else {
              _mpp_log_l(2,"utils","format: 0x%lx  invalid  (unspecified error occurred)",0,0);
            }
          }
        }
      }
    }
  }
  return endptr._4_4_;
}

Assistant:

MPP_RET str_to_frm_fmt(const char *nptr, long *number)
{
    MPP_RET ret = MPP_NOK;

    if (NULL == nptr || NULL == number) {
        mpp_err_f("invalid input nptr %p number %p is_valid %p\n", nptr, number);
        ret = MPP_ERR_NULL_PTR;
        goto RET;
    }

    if (nptr) {
        char *endptr = NULL;  /* pointer to additional chars  */
        long  tmp = 0;

        /* reset errno to 0 before call */
        errno = 0;

        tmp = strtol(nptr, &endptr, 0);

        if (nptr == endptr)
            mpp_err("format: 0x%lx  invalid  (no digits found, 0 returned)", tmp);
        else if (errno == ERANGE && tmp == LONG_MIN)
            mpp_err("format: 0x%lx  invalid  (underflow occurred)", tmp);
        else if (errno == ERANGE && tmp == LONG_MAX)
            mpp_err("format: 0x%lx  invalid  (overflow occurred)", tmp);
        else if (errno == EINVAL)  /* not in all c99 implementations - gcc OK */
            mpp_err("format: 0x%lx  invalid  (base contains unsupported value)", tmp);
        else if (errno != 0 && tmp == 0)
            mpp_err("format: 0x%lx  invalid  (unspecified error occurred)", tmp);
        else if (errno == 0 && nptr && *endptr != 0)
            mpp_err("format: 0x%lx  invalid  (additional characters remain)", tmp);
        else if (errno == 0 && nptr && !*endptr) {
            if ((tmp < (MPP_FMT_BUTT | MPP_FRAME_FMT_PROP_MASK)) && tmp >= 0) {
                *number = tmp;
                ret = MPP_OK;
            } else {
                mpp_err("format: 0x%lx  invalid  (not format value)", tmp);
            }
        }
    }

RET:
    return ret;
}